

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O2

ZeroCopyInputStream * __thiscall
google::protobuf::compiler::DiskSourceTree::OpenVirtualFile
          (DiskSourceTree *this,string_view virtual_file,string *disk_file)

{
  pointer pMVar1;
  bool bVar2;
  bool bVar3;
  ZeroCopyInputStream *pZVar4;
  int *piVar5;
  pointer pMVar6;
  string_view path;
  string_view filename;
  string_view path_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view old_prefix;
  string_view new_prefix;
  string temp_disk_file;
  ZeroCopyInputStream *local_f0;
  string *local_e0;
  string local_d8;
  string *local_b8;
  AlphaNum local_b0;
  size_t local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  char *extraout_RDX;
  
  path_00._M_len = virtual_file._M_str;
  path_00._M_str = (char *)disk_file;
  local_b8 = disk_file;
  CanonicalizePath_abi_cxx11_((string *)&local_b0,(compiler *)virtual_file._M_len,path_00);
  __y._M_str = (char *)local_b0.piece_._M_len;
  __y._M_len = (size_t)local_b0.piece_._M_str;
  bVar2 = std::operator!=(virtual_file,__y);
  if (bVar2) {
    std::__cxx11::string::~string((string *)&local_b0);
  }
  else {
    path._M_str = extraout_RDX;
    path._M_len = (size_t)path_00._M_len;
    bVar2 = ContainsParentReference((compiler *)virtual_file._M_len,path);
    std::__cxx11::string::~string((string *)&local_b0);
    if (!bVar2) {
      pMVar6 = (this->mappings_).
               super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pMVar1 = (this->mappings_).
               super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      while (local_e0 = &this->last_error_message_, pMVar6 != pMVar1) {
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        local_d8._M_string_length = 0;
        local_d8.field_2._M_local_buf[0] = '\0';
        old_prefix._M_str = (pMVar6->virtual_path)._M_dataplus._M_p;
        old_prefix._M_len = (pMVar6->virtual_path)._M_string_length;
        new_prefix._M_str = (pMVar6->disk_path)._M_dataplus._M_p;
        new_prefix._M_len = (pMVar6->disk_path)._M_string_length;
        bVar3 = ApplyMapping(virtual_file,old_prefix,new_prefix,&local_d8);
        bVar2 = true;
        if (bVar3) {
          filename._M_str = local_d8._M_dataplus._M_p;
          filename._M_len = local_d8._M_string_length;
          pZVar4 = OpenDiskFile(this,filename);
          if (pZVar4 == (ZeroCopyInputStream *)0x0) {
            piVar5 = __errno_location();
            if (*piVar5 == 0xd) {
              local_b0.piece_ =
                   absl::lts_20240722::NullSafeStringView("Read access is denied for file: ");
              local_80 = local_d8._M_string_length;
              local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_d8._M_dataplus._M_p;
              absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)&stack0xffffffffffffffb0,&local_b0);
              std::__cxx11::string::operator=((string *)local_e0,(string *)&stack0xffffffffffffffb0)
              ;
              std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
              bVar2 = false;
              local_f0 = (ZeroCopyInputStream *)0x0;
            }
          }
          else {
            if (local_b8 != (string *)0x0) {
              std::__cxx11::string::_M_assign((string *)local_b8);
            }
            bVar2 = false;
            local_f0 = pZVar4;
          }
        }
        std::__cxx11::string::~string((string *)&local_d8);
        pMVar6 = pMVar6 + 1;
        if (!bVar2) {
          return local_f0;
        }
      }
    }
  }
  std::__cxx11::string::assign((char *)&this->last_error_message_);
  return (ZeroCopyInputStream *)0x0;
}

Assistant:

io::ZeroCopyInputStream* DiskSourceTree::OpenVirtualFile(
    absl::string_view virtual_file, std::string* disk_file) {
  if (virtual_file != CanonicalizePath(virtual_file) ||
      ContainsParentReference(virtual_file)) {
    // We do not allow importing of paths containing things like ".." or
    // consecutive slashes since the compiler expects files to be uniquely
    // identified by file name.
    last_error_message_ =
        "Backslashes, consecutive slashes, \".\", or \"..\" "
        "are not allowed in the virtual path";
    return nullptr;
  }

  for (const auto& mapping : mappings_) {
    std::string temp_disk_file;
    if (ApplyMapping(virtual_file, mapping.virtual_path, mapping.disk_path,
                     &temp_disk_file)) {
      io::ZeroCopyInputStream* stream = OpenDiskFile(temp_disk_file);
      if (stream != nullptr) {
        if (disk_file != nullptr) {
          *disk_file = temp_disk_file;
        }
        return stream;
      }

      if (errno == EACCES) {
        // The file exists but is not readable.
        last_error_message_ =
            absl::StrCat("Read access is denied for file: ", temp_disk_file);
        return nullptr;
      }
    }
  }
  last_error_message_ = "File not found.";
  return nullptr;
}